

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

void __thiscall
QPDF_Array::QPDF_Array
          (QPDF_Array *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v,
          bool sparse)

{
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  bool bVar1;
  qpdf_object_type_e qVar2;
  BaseHandle *this_01;
  pointer __k;
  mapped_type *this_02;
  pointer pSVar3;
  QPDFObjectHandle *item;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> local_28;
  byte local_19;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvStack_18;
  bool sparse_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v_local;
  QPDF_Array *this_local;
  
  local_19 = sparse;
  pvStack_18 = v;
  v_local = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this;
  std::unique_ptr<QPDF_Array::Sparse,std::default_delete<QPDF_Array::Sparse>>::
  unique_ptr<std::default_delete<QPDF_Array::Sparse>,void>
            ((unique_ptr<QPDF_Array::Sparse,std::default_delete<QPDF_Array::Sparse>> *)this);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->elements);
  if ((local_19 & 1) == 0) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
              (&this->elements,pvStack_18);
  }
  else {
    std::make_unique<QPDF_Array::Sparse>();
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::operator=
              (&this->sp,&local_28);
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
              (&local_28);
    this_00 = pvStack_18;
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(pvStack_18);
    item = (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&item), bVar1) {
      this_01 = &__gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end2)->super_BaseHandle;
      qVar2 = ::qpdf::BaseHandle::raw_type_code(this_01);
      if ((qVar2 != ot_null) || (bVar1 = ::qpdf::BaseHandle::indirect(this_01), bVar1)) {
        pSVar3 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->(&this->sp);
        __k = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
              operator->(&this->sp);
        this_02 = std::
                  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                  ::operator[](&pSVar3->elements,&__k->size);
        QPDFObjectHandle::operator=(this_02,(QPDFObjectHandle *)this_01);
      }
      pSVar3 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
               operator->(&this->sp);
      pSVar3->size = pSVar3->size + 1;
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

QPDF_Array::QPDF_Array(std::vector<QPDFObjectHandle>&& v, bool sparse)
{
    if (sparse) {
        sp = std::make_unique<Sparse>();
        for (auto& item: v) {
            if (item.raw_type_code() != ::ot_null || item.indirect()) {
                sp->elements[sp->size] = std::move(item);
            }
            ++sp->size;
        }
    } else {
        elements = std::move(v);
    }
}